

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManPushInv_rec(If_DsdMan_t *p,int iLit,uchar *pPerm)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long in_RAX;
  ulong uVar6;
  undefined8 uStack_38;
  
  bVar2 = false;
  uStack_38 = in_RAX;
  while (-1 < iLit) {
    if ((p->vObjs).nSize <= (int)((uint)iLit >> 1)) goto LAB_00423e99;
    pvVar1 = (p->vObjs).pArray[(uint)iLit >> 1];
    uVar3 = *(uint *)((long)pvVar1 + 4) & 7;
    if (uVar3 == 4) {
      if (*(uint *)((long)pvVar1 + 4) < 0x8000000) goto LAB_00423e7c;
      uVar6 = 0;
      while( true ) {
        iLit = *(uint *)((long)pvVar1 + uVar6 * 4 + 8);
        if (iLit == 0) goto LAB_00423e7c;
        iVar4 = If_DsdManCheckInv_rec(p,iLit);
        if (iVar4 != 0) break;
        if (iLit < 0) goto LAB_00423eb8;
        if ((p->vObjs).nSize <= (int)((uint)iLit >> 1)) goto LAB_00423e99;
        pPerm = pPerm + (*(uint *)((long)(p->vObjs).pArray[(uint)iLit >> 1] + 4) >> 3 & 0x1f);
        uVar6 = uVar6 + 1;
        if (*(uint *)((long)pvVar1 + 4) >> 0x1b <= uVar6) goto LAB_00423e7c;
      }
    }
    else {
      if (uVar3 != 5) {
        if (uVar3 != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x5d5,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
        }
        *pPerm = *pPerm ^ 1;
LAB_00423e7c:
        uVar3 = 1;
        if (bVar2) {
          uVar3 = uStack_38._4_4_;
        }
        return uVar3;
      }
      iVar4 = If_DsdManCheckInv_rec(p,*(int *)((long)pvVar1 + 0xc));
      if ((iVar4 == 0) ||
         (iVar4 = If_DsdManCheckInv_rec(p,*(int *)((long)pvVar1 + 0x10)), iVar4 == 0)) {
        __assert_fail("If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x5cf,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
      }
      if ((int)*(uint *)((long)pvVar1 + 8) < 0) break;
      uVar3 = *(uint *)((long)pvVar1 + 8) >> 1;
      if ((p->vObjs).nSize <= (int)uVar3) {
LAB_00423e99:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar3 = *(uint *)((long)(p->vObjs).pArray[uVar3] + 4);
      If_DsdManPushInv_rec(p,*(int *)((long)pvVar1 + 0xc),pPerm + (uVar3 >> 3 & 0x1f));
      if ((int)*(uint *)((long)pvVar1 + 0xc) < 0) break;
      uVar5 = *(uint *)((long)pvVar1 + 0xc) >> 1;
      if ((p->vObjs).nSize <= (int)uVar5) goto LAB_00423e99;
      pPerm = pPerm + (uVar3 >> 3 & 0x1f) +
              (*(uint *)((long)(p->vObjs).pArray[uVar5] + 4) >> 3 & 0x1f);
      iLit = *(uint *)((long)pvVar1 + 0x10);
    }
    if (!bVar2) {
      uStack_38._4_4_ = 1;
    }
    uStack_38 = (ulong)uStack_38._4_4_ << 0x20;
    bVar2 = true;
  }
LAB_00423eb8:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int If_DsdManPushInv_rec( If_DsdMan_t * p, int iLit, unsigned char * pPerm )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        pPerm[0] = (unsigned char)Abc_LitNot((int)pPerm[0]);
    else if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            if ( If_DsdManCheckInv_rec(p, iFanin) )
            {
                If_DsdManPushInv_rec( p, iFanin, pPerm );
                break;
            }
            pPerm += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
        }
    }
    else if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        assert( If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]) );
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[0]);
        If_DsdManPushInv_rec(p, pObj->pFans[1], pPerm);
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[1]);
        If_DsdManPushInv_rec(p, pObj->pFans[2], pPerm);
    }
    else assert( 0 );
    return 1;
}